

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

int dobind(KEYMAP *curmap,char *p,int unbind)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  PF p_Var4;
  char *pcVar5;
  char *pcVar6;
  KEYMAP *pref_map;
  code *funct;
  long lVar7;
  char local_98 [8];
  char bprompt [80];
  KEYMAP *local_38;
  KEYMAP *curmap_local;
  
  local_38 = curmap;
  if (macrodef != 0) {
    iVar2 = dobeep_msg("Can\'t rebind key in macro");
    return iVar2;
  }
  if (inmacro == 0) {
    uVar3 = strlcpy(local_98,p,0x50);
    lVar7 = 0x4f;
    if (uVar3 < 0x50) {
      lVar7 = (long)(int)uVar3;
    }
    pcVar6 = local_98 + lVar7;
    while( true ) {
      ewprintf("%s",local_98);
      pcVar6[-1] = ' ';
      iVar2 = getkey(0);
      pcVar5 = getkeyname(pcVar6,(size_t)(bprompt + (0x48 - (long)pcVar6)),iVar2);
      p_Var4 = doscan(local_38,iVar2,&local_38);
      if (p_Var4 != (PF)0x0) break;
      pcVar6 = pcVar5 + 1;
      pcVar5[0] = '-';
      pcVar5[1] = '\0';
    }
  }
  else {
    if (maclcur->l_used < 2) {
      lVar7 = 0;
    }
    else {
      lVar7 = 0;
      do {
        bVar1 = maclcur->l_text[lVar7];
        p_Var4 = doscan(local_38,(uint)bVar1,&local_38);
        if ((p_Var4 != (PF)0x0) &&
           (iVar2 = remap(local_38,(uint)bVar1,(PF)0x0,(KEYMAP *)0x0), iVar2 != 1)) {
          return 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (long)maclcur->l_used + -1);
    }
    iVar2 = (int)maclcur->l_text[lVar7];
    doscan(local_38,iVar2,(KEYMAP **)0x0);
    maclcur = maclcur->l_fp;
  }
  if (unbind == 0) {
    pcVar6 = eread("%s to command: ",local_98,0x50,9,local_98);
    if (pcVar6 == (char *)0x0) {
      return 2;
    }
    if (*pcVar6 == '\0') {
      return 0;
    }
    funct = name_function(local_98);
    if (funct == (PF)0x0) {
      pref_map = name_map(local_98);
      if (pref_map == (KEYMAP *)0x0) {
        iVar2 = dobeep_msg("[No match]");
        return iVar2;
      }
      funct = (PF)0x0;
      goto LAB_0010e09b;
    }
  }
  else {
    funct = rescan;
  }
  pref_map = (KEYMAP *)0x0;
LAB_0010e09b:
  iVar2 = remap(local_38,iVar2,funct,pref_map);
  return iVar2;
}

Assistant:

static int
dobind(KEYMAP *curmap, const char *p, int unbind)
{
	KEYMAP	*pref_map = NULL;
	PF	 funct;
	char	 bprompt[80], *bufp, *pep;
	int	 c, s, n;

	if (macrodef) {
		/*
		 * Keystrokes aren't collected. Not hard, but pretty useless.
		 * Would not work for function keys in any case.
		 */
		return (dobeep_msg("Can't rebind key in macro"));
	}
	if (inmacro) {
		for (s = 0; s < maclcur->l_used - 1; s++) {
			if (doscan(curmap, c = CHARMASK(maclcur->l_text[s]), &curmap)
			    != NULL) {
				if (remap(curmap, c, NULL, NULL)
				    != TRUE)
					return (FALSE);
			}
		}
		(void)doscan(curmap, c = maclcur->l_text[s], NULL);
		maclcur = maclcur->l_fp;
	} else {
		n = strlcpy(bprompt, p, sizeof(bprompt));
		if (n >= sizeof(bprompt))
			n = sizeof(bprompt) - 1;
		pep = bprompt + n;
		for (;;) {
			ewprintf("%s", bprompt);
			pep[-1] = ' ';
			pep = getkeyname(pep, sizeof(bprompt) -
			    (pep - bprompt), c = getkey(FALSE));
			if (doscan(curmap, c, &curmap) != NULL)
				break;
			*pep++ = '-';
			*pep = '\0';
		}
	}
	if (unbind)
		funct = rescan;
	else {
		if ((bufp = eread("%s to command: ", bprompt, sizeof(bprompt),
		    EFFUNC | EFNEW, bprompt)) == NULL)
			return (ABORT);
		else if (bufp[0] == '\0')
			return (FALSE);
		if (((funct = name_function(bprompt)) == NULL) ?
		    (pref_map = name_map(bprompt)) == NULL : funct == NULL)
			return (dobeep_msg("[No match]"));

	}
	return (remap(curmap, c, funct, pref_map));
}